

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::WriteTargetClean(cmGlobalNinjaGenerator *this,ostream *os)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  cmNinjaRule rule;
  allocator<char> local_1d1;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  string local_170;
  undefined1 local_150 [64];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_110 [32];
  char local_f0 [16];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_e0 [184];
  
  bVar1 = WriteTargetCleanAdditional(this,os);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"CLEAN",(allocator<char> *)&local_1b0);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_150,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  NinjaCmd_abi_cxx11_(&local_1d0,this);
  std::operator+(&local_1b0,&local_1d0," -t clean");
  std::__cxx11::string::operator=((string *)(local_150 + 0x20),(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::assign((char *)local_110);
  std::__cxx11::string::assign(local_f0);
  WriteRule((ostream *)
            (this->RulesFileStream)._M_t.
            super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
            .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
            (cmNinjaRule *)local_150);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_150);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"CLEAN",(allocator<char> *)&local_1b0);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_150,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::assign((char *)local_150);
  iVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x21])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,(char *)CONCAT44(extraout_var,iVar2),&local_1d1);
  NinjaOutputPath(&local_1b0,this,&local_1d0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_110,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"CMakeFiles/clean.additional",&local_1d1);
    NinjaOutputPath(&local_1b0,this,&local_1d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_e0,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  WriteBuild(this,os,(cmNinjaBuild *)local_150,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_150);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetClean(std::ostream& os)
{
  // -- Additional clean target
  bool additionalFiles = WriteTargetCleanAdditional(os);

  // -- Default clean target
  // Write rule
  {
    cmNinjaRule rule("CLEAN");
    rule.Command = NinjaCmd() + " -t clean";
    rule.Description = "Cleaning all built files...";
    rule.Comment = "Rule for cleaning all built files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  // Write build
  {
    cmNinjaBuild build("CLEAN");
    build.Comment = "Clean all the built files.";
    build.Outputs.push_back(this->NinjaOutputPath(this->GetCleanTargetName()));
    if (additionalFiles) {
      build.ExplicitDeps.push_back(
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName()));
    }
    WriteBuild(os, build);
  }
}